

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::make_huff_table(jpeg_decoder *this,int index,huff_tables *pH)

{
  byte bVar1;
  byte bVar2;
  uint8 *puVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint8 huffsize [258];
  uint huffcode [258];
  
  pH->ac_table = this->m_huff_ac[index] != '\0';
  puVar3 = this->m_huff_num[index];
  uVar15 = 0;
  for (lVar7 = 1; lVar7 != 0x11; lVar7 = lVar7 + 1) {
    uVar16 = uVar15 + puVar3[lVar7];
    for (lVar10 = (long)(int)uVar15; (int)uVar16 != lVar10; lVar10 = lVar10 + 1) {
      if (0x100 < lVar10) goto LAB_00142f2e;
      huffsize[lVar10] = (uint8)lVar7;
    }
    uVar15 = uVar16;
  }
  if (0x101 < (int)uVar15) {
    __assert_fail("p < 258",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                  ,0x8c6,"void jpgd::jpeg_decoder::make_huff_table(int, huff_tables *)");
  }
  huffsize[(int)uVar15] = '\0';
  uVar16 = (uint)huffsize[0];
  lVar7 = 0;
  uVar8 = 0;
  while (huffsize[0] != 0) {
    lVar10 = lVar7 << 0x20;
    lVar7 = (long)(int)lVar7;
    uVar13 = uVar8 * 2;
    while (uVar16 == huffsize[0]) {
      if (0x100 < lVar7) goto LAB_00142f2e;
      huffcode[lVar7] = uVar8;
      lVar4 = lVar7 + 1;
      lVar7 = lVar7 + 1;
      uVar8 = uVar8 + 1;
      lVar10 = lVar10 + 0x100000000;
      uVar13 = uVar13 + 2;
      huffsize[0] = huffsize[lVar4];
    }
    uVar16 = uVar16 + 1;
    uVar8 = uVar13;
    huffsize[0] = huffsize[lVar10 >> 0x20];
  }
  uVar11 = 0;
  uVar17 = (ulong)uVar15;
  if ((int)uVar15 < 1) {
    uVar17 = uVar11;
  }
  memset(pH->look_up,0,0x1100);
  uVar8 = 0xffffffff;
  do {
    if (uVar11 == uVar17) {
      return;
    }
    bVar1 = this->m_huff_val[index][uVar11];
    uVar16 = huffcode[uVar11];
    bVar2 = huffsize[uVar11];
    uVar15 = (uint)bVar2;
    pH->code_size[bVar1] = bVar2;
    if (bVar2 < 9) {
      uVar14 = (ulong)(uVar16 << (8 - bVar2 & 0x1f));
      uVar15 = (bVar1 & 0xf) + uVar15;
      for (iVar12 = 1 << (8 - bVar2 & 0x1f); 0 < iVar12; iVar12 = iVar12 + -1) {
        if (0xff < uVar14) goto LAB_00142f2e;
        pH->look_up[uVar14] = (uint)bVar1;
        uVar16 = (uint)CONCAT11(bVar2,bVar1);
        if (uVar15 < 9 && (bVar1 & 0xf) != 0) {
          uVar16 = (uint)bVar1 +
                   (((uint)uVar14 >> (8U - (char)uVar15 & 0x1f) & ~(-1 << (sbyte)(bVar1 & 0xf))) <<
                    0x10 | uVar15 * 0x100) + 0x8000;
        }
        pH->look_up2[uVar14] = uVar16;
        uVar14 = uVar14 + 1;
      }
    }
    else {
      uVar5 = uVar16 >> (bVar2 - 8 & 0x1f) & 0xff;
      uVar13 = pH->look_up[uVar5];
      uVar9 = uVar8;
      if (uVar13 == 0) {
        pH->look_up[uVar5] = uVar8;
        pH->look_up2[uVar5] = uVar8;
        uVar9 = uVar8 - 2;
        uVar13 = uVar8;
      }
      uVar16 = uVar16 << (0x18 - bVar2 & 0x1f);
      uVar8 = uVar9;
      while( true ) {
        uVar5 = (uVar13 - 1) + (uint)((uVar16 >> 0xf & 1) != 0);
        uVar6 = ~uVar5;
        if ((int)uVar15 < 10) break;
        if (uVar5 < 0xfffffe00) goto LAB_00142f2e;
        uVar13 = pH->tree[uVar6];
        uVar9 = uVar8;
        if (uVar13 == 0) {
          pH->tree[uVar6] = uVar8;
          uVar9 = uVar8 - 2;
          uVar13 = uVar8;
        }
        uVar16 = uVar16 * 2;
        uVar15 = uVar15 - 1;
        uVar8 = uVar9;
      }
      if ((int)uVar5 < -0x200) {
LAB_00142f2e:
        stop_decoding(this,JPGD_DECODE_ERROR);
      }
      pH->tree[(int)uVar6] = (uint)bVar1;
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void jpeg_decoder::make_huff_table(int index, huff_tables* pH)
	{
		int p, i, l, si;
		uint8 huffsize[258];
		uint huffcode[258];
		uint code;
		uint subtree;
		int code_size;
		int lastp;
		int nextfreeentry;
		int currententry;

		pH->ac_table = m_huff_ac[index] != 0;

		p = 0;

		for (l = 1; l <= 16; l++)
		{
			for (i = 1; i <= m_huff_num[index][l]; i++)
			{
				if (p >= 257)
					stop_decoding(JPGD_DECODE_ERROR);
				huffsize[p++] = static_cast<uint8>(l);
			}
		}

		assert(p < 258);
		huffsize[p] = 0;

		lastp = p;

		code = 0;
		si = huffsize[0];
		p = 0;

		while (huffsize[p])
		{
			while (huffsize[p] == si)
			{
				if (p >= 257)
					stop_decoding(JPGD_DECODE_ERROR);
				huffcode[p++] = code;
				code++;
			}

			code <<= 1;
			si++;
		}

		memset(pH->look_up, 0, sizeof(pH->look_up));
		memset(pH->look_up2, 0, sizeof(pH->look_up2));
		memset(pH->tree, 0, sizeof(pH->tree));
		memset(pH->code_size, 0, sizeof(pH->code_size));

		nextfreeentry = -1;

		p = 0;

		while (p < lastp)
		{
			i = m_huff_val[index][p];

			code = huffcode[p];
			code_size = huffsize[p];

			assert(i < JPGD_HUFF_CODE_SIZE_MAX_LENGTH);
			pH->code_size[i] = static_cast<uint8>(code_size);

			if (code_size <= 8)
			{
				code <<= (8 - code_size);

				for (l = 1 << (8 - code_size); l > 0; l--)
				{
					if (code >= 256)
						stop_decoding(JPGD_DECODE_ERROR);

					pH->look_up[code] = i;

					bool has_extrabits = false;
					int extra_bits = 0;
					int num_extra_bits = i & 15;

					int bits_to_fetch = code_size;
					if (num_extra_bits)
					{
						int total_codesize = code_size + num_extra_bits;
						if (total_codesize <= 8)
						{
							has_extrabits = true;
							extra_bits = ((1 << num_extra_bits) - 1) & (code >> (8 - total_codesize));

							if (extra_bits > 0x7FFF)
								stop_decoding(JPGD_DECODE_ERROR);

							bits_to_fetch += num_extra_bits;
						}
					}

					if (!has_extrabits)
						pH->look_up2[code] = i | (bits_to_fetch << 8);
					else
						pH->look_up2[code] = i | 0x8000 | (extra_bits << 16) | (bits_to_fetch << 8);

					code++;
				}
			}
			else
			{
				subtree = (code >> (code_size - 8)) & 0xFF;

				currententry = pH->look_up[subtree];

				if (currententry == 0)
				{
					pH->look_up[subtree] = currententry = nextfreeentry;
					pH->look_up2[subtree] = currententry = nextfreeentry;

					nextfreeentry -= 2;
				}

				code <<= (16 - (code_size - 8));

				for (l = code_size; l > 9; l--)
				{
					if ((code & 0x8000) == 0)
						currententry--;

					unsigned int idx = -currententry - 1;

					if (idx >= JPGD_HUFF_TREE_MAX_LENGTH)
						stop_decoding(JPGD_DECODE_ERROR);

					if (pH->tree[idx] == 0)
					{
						pH->tree[idx] = nextfreeentry;

						currententry = nextfreeentry;

						nextfreeentry -= 2;
					}
					else
					{
						currententry = pH->tree[idx];
					}

					code <<= 1;
				}

				if ((code & 0x8000) == 0)
					currententry--;

				if ((-currententry - 1) >= JPGD_HUFF_TREE_MAX_LENGTH)
					stop_decoding(JPGD_DECODE_ERROR);

				pH->tree[-currententry - 1] = i;
			}

			p++;
		}
	}